

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue_p.h
# Opt level: O2

QCborValue * __thiscall
QCborContainerPrivate::findCborMapKey<QStringView>
          (QCborValue *__return_storage_ptr__,QCborContainerPrivate *this,QCborValue *self,
          QStringView key)

{
  QStringView key_00;
  QCborValueConstRef QVar1;
  
  if ((*(int *)&(this->data).d.d == 0xa0) &&
     ((QCborContainerPrivate *)this->usedData != (QCborContainerPrivate *)0x0)) {
    key_00.m_data = (storage_type_conflict *)key.m_size;
    key_00.m_size = (qsizetype)self;
    QVar1 = findCborMapKey<QStringView>((QCborContainerPrivate *)this->usedData,key_00);
    if (QVar1.i < (((QCborContainerPrivate *)this->usedData)->elements).d.size) {
      valueAt(__return_storage_ptr__,(QCborContainerPrivate *)this->usedData,QVar1.i);
      return __return_storage_ptr__;
    }
  }
  __return_storage_ptr__->n = 0;
  __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
  __return_storage_ptr__->t = Undefined;
  return __return_storage_ptr__;
}

Assistant:

static QCborValue findCborMapKey(const QCborValue &self, KeyType key)
    {
        if (self.isMap() && self.container) {
            qsizetype idx = self.container->findCborMapKey(key).i;
            if (idx < self.container->elements.size())
                return self.container->valueAt(idx);
        }
        return QCborValue();
    }